

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O1

void __thiscall
ot::commissioner::CommissionerImpl::HandleEnergyReport(CommissionerImpl *this,Request *aRequest)

{
  Tlv *pTVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  undefined4 uVar3;
  char *pcVar4;
  mapped_type *pmVar5;
  ByteArray *pBVar6;
  char *pcVar7;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  char *pcVar8;
  bool bVar9;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  Error error;
  ByteArray energyList;
  ChannelMask channelMask;
  writer write;
  string peerAddr;
  TlvSet tlvSet;
  undefined1 local_188 [8];
  _Alloc_hider _Stack_180;
  format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>
  *local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_170;
  code *local_160;
  code *local_158;
  string local_148;
  CommissionerImpl *local_128;
  undefined1 local_120 [8];
  _Alloc_hider local_118;
  size_type local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_f8;
  ChannelMask local_d8;
  string local_c0;
  undefined1 local_a0 [32];
  string local_80;
  _Rb_tree<ot::commissioner::tlv::Type,_std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>,_std::_Select1st<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
  local_60;
  
  local_118._M_p = (pointer)&local_108;
  local_120._0_4_ = kNone;
  local_110 = 0;
  local_108._M_local_buf[0] = '\0';
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_d8.
  super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.
  super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.
  super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128 = this;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  (*aRequest->mEndpoint->_vptr_Endpoint[3])(local_188);
  Address::ToString_abi_cxx11_(&local_80,(Address *)local_188);
  if ((type  [2])local_188 != (type  [2])0x0) {
    operator_delete((void *)local_188);
  }
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"mgmt","");
  local_188._0_4_ = string_type;
  pcVar7 = "received MGMT_ED_REPORT.ans from {}";
  _Stack_180._M_p = "received MGMT_ED_REPORT.ans from {}";
  local_178 = (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>
               *)0x23;
  aStack_170._M_allocated_capacity = 0x100000000;
  local_160 = ::fmt::v10::detail::
              parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
  ;
  aStack_170._8_8_ = local_188;
  local_a0._0_8_ =
       (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>
        *)local_188;
  do {
    if (pcVar7 == "") break;
    pcVar8 = pcVar7;
    if (*pcVar7 == '{') {
LAB_001cbf1f:
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::writer::operator()((writer *)local_a0,pcVar7,pcVar8);
      pcVar7 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                         (pcVar8,"",
                          (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_188);
      bVar9 = true;
    }
    else {
      pcVar8 = pcVar7 + 1;
      bVar9 = pcVar8 != "";
      if (bVar9) {
        if (*pcVar8 != '{') {
          pcVar4 = pcVar7 + 2;
          do {
            pcVar8 = pcVar4;
            bVar9 = pcVar8 != "";
            if (pcVar8 == "") goto LAB_001cbf1b;
            pcVar4 = pcVar8 + 1;
          } while (*pcVar8 != '{');
        }
        bVar9 = true;
      }
LAB_001cbf1b:
      if (bVar9) goto LAB_001cbf1f;
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::writer::operator()((writer *)local_a0,pcVar7,"");
      bVar9 = false;
    }
  } while (bVar9);
  local_188 = (undefined1  [8])local_80._M_dataplus._M_p;
  _Stack_180._M_p = (pointer)local_80._M_string_length;
  fmt.size_ = 0xd;
  fmt.data_ = (char *)0x23;
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)local_188;
  ::fmt::v10::vformat_abi_cxx11_(&local_c0,(v10 *)"received MGMT_ED_REPORT.ans from {}",fmt,args);
  Log(kInfo,&local_148,&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p);
  }
  ProxyClient::SendEmptyChanged(&local_128->mProxyClient,aRequest);
  tlv::GetTlvSet((Error *)local_188,(TlvSet *)&local_60,&aRequest->mPayload,kMeshCoP);
  local_120._0_4_ = local_188._0_4_;
  std::__cxx11::string::operator=((string *)&local_118,(string *)&_Stack_180);
  uVar3 = local_120._0_4_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Stack_180._M_p != &aStack_170) {
    operator_delete(_Stack_180._M_p);
  }
  if (uVar3 != none_type) goto LAB_001cc150;
  local_188[0] = 0x35;
  pmVar5 = std::
           map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
           ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                         *)&local_60,local_188);
  pTVar1 = (pmVar5->super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  p_Var2 = (pmVar5->super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  if (pTVar1 == (Tlv *)0x0) {
LAB_001cc0b5:
    bVar9 = true;
  }
  else {
    pBVar6 = tlv::Tlv::GetValue(pTVar1);
    DecodeChannelMask((Error *)local_188,&local_d8,pBVar6);
    local_120._0_4_ = local_188._0_4_;
    std::__cxx11::string::operator=((string *)&local_118,(string *)&_Stack_180);
    uVar3 = local_120._0_4_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Stack_180._M_p != &aStack_170) {
      operator_delete(_Stack_180._M_p);
    }
    if (uVar3 == none_type) goto LAB_001cc0b5;
    bVar9 = false;
  }
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  if (bVar9) {
    local_188[0] = 0x39;
    pmVar5 = std::
             map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
             ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                           *)&local_60,local_188);
    pTVar1 = (pmVar5->super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    p_Var2 = (pmVar5->super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
    }
    if (pTVar1 != (Tlv *)0x0) {
      pBVar6 = tlv::Tlv::GetValue(pTVar1);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(&local_f8,pBVar6);
    }
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    (*local_128->mCommissionerHandler->_vptr_CommissionerHandler[5])
              (local_128->mCommissionerHandler,&local_80,&local_d8,&local_f8);
  }
LAB_001cc150:
  if (local_120._0_4_ != none_type) {
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"mgmt","");
    local_188._0_4_ = string_type;
    local_188._4_4_ = string_type;
    pcVar7 = "handle MGMT_ED_REPORT.ans from {} failed: {}";
    _Stack_180._M_p = "handle MGMT_ED_REPORT.ans from {} failed: {}";
    local_178 = (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>
                 *)0x2c;
    aStack_170._M_allocated_capacity = 0x200000000;
    local_160 = ::fmt::v10::detail::
                parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
    ;
    local_158 = ::fmt::v10::detail::
                parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
    ;
    aStack_170._8_8_ = local_188;
    local_a0._0_8_ =
         (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>
          *)local_188;
    do {
      if (pcVar7 == "") break;
      pcVar8 = pcVar7;
      if (*pcVar7 == '{') {
LAB_001cc219:
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::writer::operator()((writer *)local_a0,pcVar7,pcVar8);
        pcVar7 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string,std::__cxx11::string>&>
                           (pcVar8,"",
                            (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>
                             *)local_188);
        bVar9 = true;
      }
      else {
        pcVar8 = pcVar7 + 1;
        bVar9 = pcVar8 != "";
        if (bVar9) {
          if (*pcVar8 != '{') {
            pcVar4 = pcVar7 + 2;
            do {
              pcVar8 = pcVar4;
              bVar9 = pcVar8 != "";
              if (pcVar8 == "") goto LAB_001cc215;
              pcVar4 = pcVar8 + 1;
            } while (*pcVar8 != '{');
          }
          bVar9 = true;
        }
LAB_001cc215:
        if (bVar9) goto LAB_001cc219;
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::writer::operator()((writer *)local_a0,pcVar7,"");
        bVar9 = false;
      }
    } while (bVar9);
    Error::ToString_abi_cxx11_((string *)local_a0,(Error *)local_120);
    local_188 = (undefined1  [8])local_80._M_dataplus._M_p;
    _Stack_180._M_p = (pointer)local_80._M_string_length;
    local_178 = (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>
                 *)local_a0._0_8_;
    aStack_170._M_allocated_capacity = local_a0._8_8_;
    fmt_00.size_ = 0xdd;
    fmt_00.data_ = (char *)0x2c;
    args_00.field_1.args_ = in_R9.args_;
    args_00.desc_ = (unsigned_long_long)local_188;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_c0,(v10 *)"handle MGMT_ED_REPORT.ans from {} failed: {}",fmt_00,args_00);
    Log(kWarn,&local_148,&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    if ((format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>
         *)local_a0._0_8_ !=
        (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>
         *)(local_a0 + 0x10)) {
      operator_delete((void *)local_a0._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  if (local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>::
  ~vector(&local_d8);
  std::
  _Rb_tree<ot::commissioner::tlv::Type,_std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>,_std::_Select1st<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
  ::~_Rb_tree(&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_p != &local_108) {
    operator_delete(local_118._M_p);
  }
  return;
}

Assistant:

void CommissionerImpl::HandleEnergyReport(const coap::Request &aRequest)
{
    Error       error;
    tlv::TlvSet tlvSet;
    ChannelMask channelMask;
    ByteArray   energyList;
    std::string peerAddr = aRequest.GetEndpoint()->GetPeerAddr().ToString();

    LOG_INFO(LOG_REGION_MGMT, "received MGMT_ED_REPORT.ans from {}", peerAddr);

    mProxyClient.SendEmptyChanged(aRequest);

    SuccessOrExit(error = GetTlvSet(tlvSet, aRequest));
    if (auto channelMaskTlv = tlvSet[tlv::Type::kChannelMask])
    {
        SuccessOrExit(error = DecodeChannelMask(channelMask, channelMaskTlv->GetValue()));
    }
    if (auto eneryListTlv = tlvSet[tlv::Type::kEnergyList])
    {
        energyList = eneryListTlv->GetValue();
    }

    mCommissionerHandler.OnEnergyReport(peerAddr, channelMask, energyList);

exit:
    if (error != ErrorCode::kNone)
    {
        LOG_WARN(LOG_REGION_MGMT, "handle MGMT_ED_REPORT.ans from {} failed: {}", peerAddr, error.ToString());
    }
}